

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlCreateEntityParserCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 local_48;
  xmlChar *base;
  xmlChar *ID;
  xmlChar *URL;
  xmlParserCtxtPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlCreateEntityParserCtxt");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"zzz:xmlCreateEntityParserCtxt",&ID,&base,&local_48);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      URL = (xmlChar *)xmlCreateEntityParserCtxt(ID,base,local_48);
      self_local = libxml_xmlParserCtxtPtrWrap((xmlParserCtxtPtr)URL);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlCreateEntityParserCtxt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlParserCtxtPtr c_retval;
    xmlChar * URL;
    xmlChar * ID;
    xmlChar * base;

    if (libxml_deprecationWarning("xmlCreateEntityParserCtxt") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"zzz:xmlCreateEntityParserCtxt", &URL, &ID, &base))
        return(NULL);

    c_retval = xmlCreateEntityParserCtxt(URL, ID, base);
    py_retval = libxml_xmlParserCtxtPtrWrap((xmlParserCtxtPtr) c_retval);
    return(py_retval);
}